

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O0

void __thiscall Image_ExrMetadata_Test::TestBody(Image_ExrMetadata_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  Point2<int> p2;
  Point2<int> p1;
  Point2i res_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Point2i resolution;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  mapped_type *this_00;
  iterator expression_text;
  pointer ppVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined4 uVar5;
  double dVar6;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar__6;
  iterator iter;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar;
  ImageMetadata *inMetadata;
  ImageAndMetadata read;
  AssertionResult gtest_ar_;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  stringVectors;
  Point2i fullRes;
  Bounds2i pb;
  SquareMatrix<4> w2n;
  SquareMatrix<4> w2c;
  ImageMetadata outMetadata;
  string filename;
  Image image;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  Point2i res;
  RGBColorSpace **in_stack_fffffffffffff288;
  ImageMetadata *this_02;
  undefined1 success;
  ImageMetadata *in_stack_fffffffffffff290;
  ImageAndMetadata *this_03;
  undefined4 in_stack_fffffffffffff298;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff29c;
  undefined4 in_stack_fffffffffffff2a0;
  undefined4 in_stack_fffffffffffff2a4;
  undefined4 in_stack_fffffffffffff2a8;
  undefined4 uVar8;
  int in_stack_fffffffffffff2ac;
  undefined4 in_stack_fffffffffffff2b0;
  undefined4 uVar9;
  int in_stack_fffffffffffff2b4;
  int args_12;
  Type in_stack_fffffffffffff2bc;
  undefined4 in_stack_fffffffffffff2c0;
  int iVar10;
  int in_stack_fffffffffffff2c4;
  undefined6 in_stack_fffffffffffff2c8;
  undefined1 in_stack_fffffffffffff2ce;
  undefined1 in_stack_fffffffffffff2cf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff2d0;
  double in_stack_fffffffffffff2d8;
  double in_stack_fffffffffffff2e0;
  int in_stack_fffffffffffff2e8;
  int in_stack_fffffffffffff2ec;
  char *in_stack_fffffffffffff2f0;
  int in_stack_fffffffffffff2f8;
  undefined2 in_stack_fffffffffffff2fc;
  undefined1 in_stack_fffffffffffff2fe;
  undefined1 in_stack_fffffffffffff2ff;
  SquareMatrix<4> *in_stack_fffffffffffff300;
  AssertionResult *in_stack_fffffffffffff308;
  AssertionResult *assertion_result;
  AssertHelper *in_stack_fffffffffffff310;
  undefined7 in_stack_fffffffffffff318;
  undefined1 in_stack_fffffffffffff31f;
  float args_9;
  undefined8 in_stack_fffffffffffff320;
  float in_stack_fffffffffffff328;
  int in_stack_fffffffffffff32c;
  float args_14;
  undefined8 in_stack_fffffffffffff330;
  int args_5;
  undefined8 in_stack_fffffffffffff340;
  int args_7;
  undefined8 in_stack_fffffffffffff348;
  int in_stack_fffffffffffff350;
  int args_9_00;
  undefined8 in_stack_fffffffffffff358;
  int in_stack_fffffffffffff360;
  undefined4 in_stack_fffffffffffff364;
  int args_11;
  Image *in_stack_fffffffffffff368;
  int in_stack_fffffffffffff370;
  undefined2 in_stack_fffffffffffff374;
  undefined1 in_stack_fffffffffffff376;
  undefined1 in_stack_fffffffffffff377;
  int in_stack_fffffffffffff378;
  undefined4 in_stack_fffffffffffff37c;
  undefined7 in_stack_fffffffffffff380;
  undefined1 in_stack_fffffffffffff387;
  string *local_b68;
  string *local_b00;
  string local_ab8 [55];
  allocator<char> local_a81;
  string local_a80 [32];
  AssertionResult local_a60 [2];
  AssertionResult local_a40 [2];
  AssertionResult local_a20;
  string local_a10 [48];
  _Self local_9e0;
  AssertionResult local_9d8;
  undefined1 local_9c1 [33];
  _Self local_9a0 [3];
  size_type local_988;
  undefined4 local_97c;
  AssertionResult local_978 [2];
  allocator<char> local_951;
  string local_950 [32];
  AssertionResult local_930 [2];
  size_type local_910;
  undefined4 local_904;
  AssertionResult local_900 [2];
  AssertionResult local_8e0;
  string local_8d0 [48];
  AssertionResult local_8a0 [2];
  AssertionResult local_880;
  string local_870 [48];
  AssertionResult local_840 [2];
  AssertionResult local_820;
  string local_810 [48];
  AssertionResult local_7e0 [2];
  AssertionResult local_7c0;
  string local_7b0 [48];
  AssertionResult local_780 [2];
  undefined4 local_75c;
  AssertionResult local_758;
  string local_748 [48];
  AssertionResult local_718 [2];
  AssertionResult local_6f8;
  optional *local_6e8;
  string local_6d0 [184];
  optional local_618 [304];
  string local_4e8 [48];
  string local_4b8 [32];
  AssertionResult local_498;
  allocator<char> local_481;
  string local_480 [39];
  allocator<char> local_459;
  string local_458 [37];
  undefined1 local_433;
  allocator<char> local_432;
  allocator<char> local_431;
  string *local_430;
  string local_428 [32];
  undefined1 local_408 [32];
  string *local_3e8;
  undefined8 local_3e0;
  ColorEncoding *in_stack_fffffffffffffce8;
  string *in_stack_fffffffffffffcf0;
  Allocator in_stack_fffffffffffffcf8;
  allocator<char> local_1c1;
  string local_1c0 [36];
  undefined1 local_19c;
  allocator<char> local_19b;
  allocator<char> local_19a;
  allocator<char> local_199;
  string *local_198;
  string local_190 [32];
  undefined1 local_170 [32];
  ImageMetadata *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  Image *in_stack_fffffffffffffec0;
  string *local_130;
  undefined8 local_128;
  undefined8 local_110;
  undefined8 local_38;
  undefined8 local_10;
  
  pbrt::Point2<int>::Point2
            ((Point2<int> *)in_stack_fffffffffffff290,
             (int)((ulong)in_stack_fffffffffffff288 >> 0x20),(int)in_stack_fffffffffffff288);
  local_38 = local_10;
  res_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff32c;
  res_00.super_Tuple2<pbrt::Point2,_int>.x = (int)in_stack_fffffffffffff328;
  GetFloatPixels(res_00,(int)((ulong)in_stack_fffffffffffff320 >> 0x20));
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator
            ((polymorphic_allocator<float> *)in_stack_fffffffffffff290);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff2b4,in_stack_fffffffffffff2b0),
             (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffff2ac,in_stack_fffffffffffff2a8),
             (polymorphic_allocator<float> *)
             CONCAT44(in_stack_fffffffffffff2a4,in_stack_fffffffffffff2a0));
  local_110 = local_10;
  local_19c = 1;
  local_198 = local_190;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,
             (char *)CONCAT17(in_stack_fffffffffffff2cf,
                              CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0));
  local_198 = (string *)local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,
             (char *)CONCAT17(in_stack_fffffffffffff2cf,
                              CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0));
  local_198 = (string *)&stack0xfffffffffffffeb0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,
             (char *)CONCAT17(in_stack_fffffffffffff2cf,
                              CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0));
  local_19c = 0;
  local_130 = local_190;
  local_128 = 3;
  v._M_array._4_4_ = in_stack_fffffffffffff29c;
  v._M_array._0_4_ = in_stack_fffffffffffff298;
  v._M_len._0_4_ = in_stack_fffffffffffff2a0;
  v._M_len._4_4_ = in_stack_fffffffffffff2a4;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffff290,v);
  resolution.super_Tuple2<pbrt::Point2,_int>.y._3_1_ = in_stack_fffffffffffff387;
  resolution.super_Tuple2<pbrt::Point2,_int>._0_7_ = in_stack_fffffffffffff380;
  channels.ptr._4_2_ = in_stack_fffffffffffff374;
  channels.ptr._0_4_ = in_stack_fffffffffffff370;
  channels.ptr._6_1_ = in_stack_fffffffffffff376;
  channels.ptr._7_1_ = in_stack_fffffffffffff377;
  channels.n._0_4_ = in_stack_fffffffffffff378;
  channels.n._4_4_ = in_stack_fffffffffffff37c;
  pbrt::Image::Image(in_stack_fffffffffffff368,
                     (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                     CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),resolution,
                     channels);
  local_b00 = (string *)&local_130;
  do {
    local_b00 = local_b00 + -0x20;
    std::__cxx11::string::~string(local_b00);
    args_9 = (float)in_stack_fffffffffffff320;
    args_9_00 = (int)in_stack_fffffffffffff358;
    args_7 = (int)in_stack_fffffffffffff348;
    args_14 = (float)in_stack_fffffffffffff330;
    args_11 = (int)in_stack_fffffffffffff368;
    args_5 = (int)in_stack_fffffffffffff340;
  } while (local_b00 != local_190);
  std::allocator<char>::~allocator(&local_19b);
  std::allocator<char>::~allocator(&local_19a);
  std::allocator<char>::~allocator(&local_199);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)in_stack_fffffffffffff290);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,
             (char *)CONCAT17(in_stack_fffffffffffff2cf,
                              CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff2c4,in_stack_fffffffffffff2c0));
  std::allocator<char>::~allocator(&local_1c1);
  pbrt::ImageMetadata::ImageMetadata(in_stack_fffffffffffff290);
  pstd::optional<const_pbrt::RGBColorSpace_*>::operator=
            ((optional<const_pbrt::RGBColorSpace_*> *)in_stack_fffffffffffff290,
             in_stack_fffffffffffff288);
  pstd::optional<float>::operator=
            (&in_stack_fffffffffffff290->renderTimeSeconds,(float *)in_stack_fffffffffffff288);
  std::exp(SUB648(ZEXT464(0x3f800000),0));
  iVar10 = 1;
  args_12 = 8;
  uVar9 = 2;
  pbrt::SquareMatrix<4>::
  SquareMatrix<int,int,int,int,int,int,float,int,int,int,int,int,int,int,float>
            (in_stack_fffffffffffff300,
             (Float)CONCAT13(in_stack_fffffffffffff2ff,
                             CONCAT12(in_stack_fffffffffffff2fe,in_stack_fffffffffffff2fc)),
             in_stack_fffffffffffff2f8,(int)((ulong)in_stack_fffffffffffff2f0 >> 0x20),
             (int)in_stack_fffffffffffff2f0,in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8,
             args_5,(float)((ulong)in_stack_fffffffffffff2e0 >> 0x20),args_7,
             in_stack_fffffffffffff350,args_9_00,in_stack_fffffffffffff360,args_11,
             in_stack_fffffffffffff370,in_stack_fffffffffffff378,SUB84(in_stack_fffffffffffff2e0,0))
  ;
  dVar6 = std::cos(SUB648(ZEXT464(0x3f800000),0));
  uVar5 = SUB84(dVar6,0);
  this_03 = (ImageAndMetadata *)0x404799999999999a;
  this_02 = (ImageMetadata *)&DAT_404f99999999999a;
  uVar8 = 0x2edbe6ff;
  uVar7 = 0x40490fdb;
  pbrt::SquareMatrix<4>::
  SquareMatrix<double,double,double,double,double,double,double,double,double,float,float,int,int,int,float>
            (in_stack_fffffffffffff300,
             (Float)CONCAT13(in_stack_fffffffffffff2ff,
                             CONCAT12(in_stack_fffffffffffff2fe,in_stack_fffffffffffff2fc)),
             (double)in_stack_fffffffffffff2f0,
             (double)CONCAT44(in_stack_fffffffffffff2ec,in_stack_fffffffffffff2e8),
             in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8,(double)in_stack_fffffffffffff2d0,
             (double)CONCAT17(in_stack_fffffffffffff2cf,
                              CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)),
             (double)CONCAT44(in_stack_fffffffffffff2c4,iVar10),(double)in_stack_fffffffffffff310,
             (double)CONCAT17(in_stack_fffffffffffff31f,in_stack_fffffffffffff318),args_9,
             in_stack_fffffffffffff328,in_stack_fffffffffffff2bc,args_12,in_stack_fffffffffffff2b4,
             args_14);
  pbrt::Point2<int>::Point2((Point2<int> *)this_03,(int)((ulong)this_02 >> 0x20),(int)this_02);
  pbrt::Point2<int>::Point2((Point2<int> *)this_03,(int)((ulong)this_02 >> 0x20),(int)this_02);
  p1.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff2c4;
  p1.super_Tuple2<pbrt::Point2,_int>.x = iVar10;
  p2.super_Tuple2<pbrt::Point2,_int>.y = in_stack_fffffffffffff2bc;
  p2.super_Tuple2<pbrt::Point2,_int>.x = args_12;
  pbrt::Bounds2<int>::Bounds2((Bounds2<int> *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),p1,p2);
  pbrt::Point2<int>::Point2((Point2<int> *)this_03,(int)((ulong)this_02 >> 0x20),(int)this_02);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)0x60abe0);
  local_433 = 1;
  local_430 = local_428;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,
             (char *)CONCAT17(in_stack_fffffffffffff2cf,
                              CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
  local_430 = (string *)local_408;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,
             (char *)CONCAT17(in_stack_fffffffffffff2cf,
                              CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
  local_433 = 0;
  local_3e8 = local_428;
  local_3e0 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,
             (char *)CONCAT17(in_stack_fffffffffffff2cf,
                              CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                *)in_stack_fffffffffffff2d0,
               (key_type *)
               CONCAT17(in_stack_fffffffffffff2cf,
                        CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)));
  __l._M_array._4_4_ = in_stack_fffffffffffff2ac;
  __l._M_array._0_4_ = uVar8;
  __l._M_len._0_4_ = uVar9;
  __l._M_len._4_4_ = in_stack_fffffffffffff2b4;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),__l);
  std::__cxx11::string::~string(local_458);
  std::allocator<char>::~allocator(&local_459);
  local_b68 = (string *)&local_3e8;
  do {
    local_b68 = local_b68 + -0x20;
    std::__cxx11::string::~string(local_b68);
  } while (local_b68 != local_428);
  std::allocator<char>::~allocator(&local_432);
  std::allocator<char>::~allocator(&local_431);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=
            ((optional<pbrt::SquareMatrix<4>_> *)this_03,(SquareMatrix<4> *)this_02);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator=
            ((optional<pbrt::SquareMatrix<4>_> *)this_03,(SquareMatrix<4> *)this_02);
  pstd::optional<pbrt::Bounds2<int>_>::operator=
            ((optional<pbrt::Bounds2<int>_> *)this_03,(Bounds2<int> *)this_02);
  pstd::optional<pbrt::Point2<int>_>::operator=
            ((optional<pbrt::Point2<int>_> *)this_03,(Point2<int> *)this_02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,
             (char *)CONCAT17(in_stack_fffffffffffff2cf,
                              CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff2d0,
                         (key_type *)
                         CONCAT17(in_stack_fffffffffffff2cf,
                                  CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)));
  std::__cxx11::string::operator=((string *)this_00,"v4");
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)this_03,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)this_02);
  std::__cxx11::string::string(local_4b8,local_1c0);
  pbrt::Image::Write(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_03,SUB81((ulong)this_02 >> 0x38,0));
  std::__cxx11::string::~string(local_4b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_498);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff308,(char *)in_stack_fffffffffffff300,
               (char *)CONCAT17(in_stack_fffffffffffff2ff,
                                CONCAT16(in_stack_fffffffffffff2fe,
                                         CONCAT24(in_stack_fffffffffffff2fc,
                                                  in_stack_fffffffffffff2f8))),
               in_stack_fffffffffffff2f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_4e8);
    testing::Message::~Message((Message *)0x60b365);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60b3e0);
  std::__cxx11::string::string(local_6d0,local_1c0);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)this_03);
  pbrt::ColorEncoding::TaggedPointer((ColorEncoding *)this_03,this_02);
  pbrt::Image::Read(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8,in_stack_fffffffffffffce8);
  std::__cxx11::string::~string(local_6d0);
  local_6e8 = local_618;
  pbrt::ImageMetadata::GetColorSpace(this_02);
  testing::internal::EqHelper<false>::Compare<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
            ((char *)CONCAT44(in_stack_fffffffffffff2ac,uVar8),
             (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),
             (RGBColorSpace *)CONCAT44(in_stack_fffffffffffff29c,uVar7),(RGBColorSpace *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6f8);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::AssertionResult::failure_message((AssertionResult *)0x60b55f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0x60b5c2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60b617);
  pstd::optional::operator_cast_to_bool(local_6e8);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_03,SUB81((ulong)this_02 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_718);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff308,(char *)in_stack_fffffffffffff300,
               (char *)CONCAT17(in_stack_fffffffffffff2ff,
                                CONCAT16(in_stack_fffffffffffff2fe,
                                         CONCAT24(in_stack_fffffffffffff2fc,
                                                  in_stack_fffffffffffff2f8))),
               in_stack_fffffffffffff2f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_748);
    testing::Message::~Message((Message *)0x60b745);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60b7c0);
  local_75c = 0x4d2;
  pstd::optional<float>::operator*((optional<float> *)0x60b7d8);
  testing::internal::EqHelper<false>::Compare<int,float>
            ((char *)CONCAT44(in_stack_fffffffffffff2ac,uVar8),
             (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),
             (int *)CONCAT44(in_stack_fffffffffffff29c,uVar7),(float *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_758);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::AssertionResult::failure_message((AssertionResult *)0x60b87e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0x60b8e1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60b936);
  pstd::optional::operator_cast_to_bool(local_6e8 + 8);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_03,SUB81((ulong)this_02 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_780);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff308,(char *)in_stack_fffffffffffff300,
               (char *)CONCAT17(in_stack_fffffffffffff2ff,
                                CONCAT16(in_stack_fffffffffffff2fe,
                                         CONCAT24(in_stack_fffffffffffff2fc,
                                                  in_stack_fffffffffffff2f8))),
               in_stack_fffffffffffff2f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_7b0);
    testing::Message::~Message((Message *)0x60ba68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60bae0);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator*((optional<pbrt::SquareMatrix<4>_> *)0x60baf1);
  testing::internal::EqHelper<false>::Compare<pbrt::SquareMatrix<4>,pbrt::SquareMatrix<4>>
            ((char *)CONCAT44(in_stack_fffffffffffff2ac,uVar8),
             (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),
             (SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff29c,uVar7),(SquareMatrix<4> *)this_03
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7c0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::AssertionResult::failure_message((AssertionResult *)0x60bb97);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0x60bbfa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60bc4f);
  pstd::optional::operator_cast_to_bool(local_6e8 + 0x4c);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_03,SUB81((ulong)this_02 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7e0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff308,(char *)in_stack_fffffffffffff300,
               (char *)CONCAT17(in_stack_fffffffffffff2ff,
                                CONCAT16(in_stack_fffffffffffff2fe,
                                         CONCAT24(in_stack_fffffffffffff2fc,
                                                  in_stack_fffffffffffff2f8))),
               in_stack_fffffffffffff2f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_810);
    testing::Message::~Message((Message *)0x60bd81);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60bdf9);
  pstd::optional<pbrt::SquareMatrix<4>_>::operator*((optional<pbrt::SquareMatrix<4>_> *)0x60be0a);
  testing::internal::EqHelper<false>::Compare<pbrt::SquareMatrix<4>,pbrt::SquareMatrix<4>>
            ((char *)CONCAT44(in_stack_fffffffffffff2ac,uVar8),
             (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),
             (SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff29c,uVar7),(SquareMatrix<4> *)this_03
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_820);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::AssertionResult::failure_message((AssertionResult *)0x60beb0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0x60bf13);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60bf68);
  pstd::optional::operator_cast_to_bool(local_6e8 + 0x90);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_03,SUB81((ulong)this_02 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_840);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff308,(char *)in_stack_fffffffffffff300,
               (char *)CONCAT17(in_stack_fffffffffffff2ff,
                                CONCAT16(in_stack_fffffffffffff2fe,
                                         CONCAT24(in_stack_fffffffffffff2fc,
                                                  in_stack_fffffffffffff2f8))),
               in_stack_fffffffffffff2f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_870);
    testing::Message::~Message((Message *)0x60c09d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60c118);
  pstd::optional<pbrt::Bounds2<int>_>::operator*((optional<pbrt::Bounds2<int>_> *)0x60c12c);
  testing::internal::EqHelper<false>::Compare<pbrt::Bounds2<int>,pbrt::Bounds2<int>>
            ((char *)CONCAT44(in_stack_fffffffffffff2ac,uVar8),
             (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),
             (Bounds2<int> *)CONCAT44(in_stack_fffffffffffff29c,uVar7),(Bounds2<int> *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_880);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::AssertionResult::failure_message((AssertionResult *)0x60c1d2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0x60c235);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60c28a);
  pstd::optional::operator_cast_to_bool(local_6e8 + 0xa4);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)this_03,SUB81((ulong)this_02 >> 0x38,0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8a0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff308,(char *)in_stack_fffffffffffff300,
               (char *)CONCAT17(in_stack_fffffffffffff2ff,
                                CONCAT16(in_stack_fffffffffffff2fe,
                                         CONCAT24(in_stack_fffffffffffff2fc,
                                                  in_stack_fffffffffffff2f8))),
               in_stack_fffffffffffff2f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_8d0);
    testing::Message::~Message((Message *)0x60c3bf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60c43a);
  pstd::optional<pbrt::Point2<int>_>::operator*((optional<pbrt::Point2<int>_> *)0x60c44e);
  testing::internal::EqHelper<false>::Compare<pbrt::Point2<int>,pbrt::Point2<int>>
            ((char *)CONCAT44(in_stack_fffffffffffff2ac,uVar8),
             (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),
             (Point2<int> *)CONCAT44(in_stack_fffffffffffff29c,uVar7),(Point2<int> *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8e0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::AssertionResult::failure_message((AssertionResult *)0x60c4f4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0x60c557);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60c5af);
  local_904 = 1;
  local_910 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)0x60c5ce);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffff2ac,uVar8),
             (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),
             (int *)CONCAT44(in_stack_fffffffffffff29c,uVar7),(unsigned_long *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_900);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::AssertionResult::failure_message((AssertionResult *)0x60c672);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0x60c6d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60c72d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,
             (char *)CONCAT17(in_stack_fffffffffffff2cf,
                              CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffff2d0,
               (key_type *)
               CONCAT17(in_stack_fffffffffffff2cf,
                        CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)));
  testing::internal::EqHelper<false>::Compare<char[3],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff2ac,uVar8),
             (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),
             (char (*) [3])CONCAT44(in_stack_fffffffffffff29c,uVar7),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_03);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator(&local_951);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_930);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::AssertionResult::failure_message((AssertionResult *)0x60c893);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0x60c8f6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60c94e);
  local_97c = 1;
  local_988 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)0x60c96d);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT44(in_stack_fffffffffffff2ac,uVar8),
             (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),
             (int *)CONCAT44(in_stack_fffffffffffff29c,uVar7),(unsigned_long *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_978);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    in_stack_fffffffffffff310 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x60ca11);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)in_stack_fffffffffffff308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0x60ca74);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60cacc);
  assertion_result = (AssertionResult *)local_9c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff2d0,
             (char *)CONCAT17(in_stack_fffffffffffff2cf,
                              CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8)),
             (allocator<char> *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
  expression_text =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *)this_02,(key_type *)0x60cb14);
  local_9a0[0]._M_node = expression_text._M_node;
  std::__cxx11::string::~string((string *)(local_9c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_9c1);
  local_9e0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)this_02);
  success = (undefined1)((ulong)this_02 >> 0x38);
  std::operator!=(local_9a0,&local_9e0);
  testing::AssertionResult::AssertionResult((AssertionResult *)this_03,(bool)success);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_9d8);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)expression_text._M_node,
               (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff2fe,
                                               CONCAT24(in_stack_fffffffffffff2fc,
                                                        in_stack_fffffffffffff2f8))),
               in_stack_fffffffffffff2f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_a10);
    testing::Message::~Message((Message *)0x60ccbd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60cd35);
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)0x60cd42);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&ppVar4->second,0);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff2ac,uVar8),
             (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),
             (char (*) [4])CONCAT44(in_stack_fffffffffffff29c,uVar7),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_03);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_a20);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    in_stack_fffffffffffff2f0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x60cde2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0x60ce3f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60ce94);
  ppVar4 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)0x60cea1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](&ppVar4->second,1);
  testing::internal::EqHelper<false>::Compare<char[4],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffff2ac,uVar8),
             (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5),
             (char (*) [4])CONCAT44(in_stack_fffffffffffff29c,uVar7),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_03);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a40);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::AssertionResult::failure_message((AssertionResult *)0x60cf42);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    testing::Message::~Message((Message *)0x60cf9f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60cff7);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)CONCAT17(in_stack_fffffffffffff2cf,
                                      CONCAT16(in_stack_fffffffffffff2ce,in_stack_fffffffffffff2c8))
             ,(allocator<char> *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
  pbrt::RemoveFile((string *)0x60d041);
  testing::AssertionResult::AssertionResult((AssertionResult *)this_03,(bool)success);
  std::__cxx11::string::~string(local_a80);
  std::allocator<char>::~allocator(&local_a81);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a60);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(in_stack_fffffffffffff2c4,iVar10));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)expression_text._M_node,
               (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffff2fc,
                                                              in_stack_fffffffffffff2f8))),
               in_stack_fffffffffffff2f0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff2c4,iVar10),in_stack_fffffffffffff2bc,
               (char *)CONCAT44(in_stack_fffffffffffff2b4,uVar9),in_stack_fffffffffffff2ac,
               (char *)CONCAT44(in_stack_fffffffffffff2a4,uVar5));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffff310,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_03);
    std::__cxx11::string::~string(local_ab8);
    testing::Message::~Message((Message *)0x60d1b9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x60d231);
  pbrt::ImageAndMetadata::~ImageAndMetadata(this_03);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *)0x60d24b);
  pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)this_03);
  std::__cxx11::string::~string(local_1c0);
  pbrt::Image::~Image(&this_03->image);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)this_03);
  return;
}

Assistant:

TEST(Image, ExrMetadata) {
    Point2i res(16, 32);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);
    Image image(rgbPixels, res, {"R", "G", "B"});

    std::string filename = "metadata.exr";
    ImageMetadata outMetadata;
    outMetadata.colorSpace = RGBColorSpace::Rec2020;
    outMetadata.renderTimeSeconds = 1234;
    SquareMatrix<4> w2c(3, 1, 4, 1, 5, 9, 2, Pi, 2, 7, 1, 8, 2, 8, 1, std::exp(1.f));
    SquareMatrix<4> w2n(1.5, 2.5, 3.5, 4.75, 5.333, 6.2135, -351.2, -552., 63.2, 47.2, Pi,
                        std::cos(1.f), 0, -14, 6, 1e-10f);
    // Must be the same area as image resolution.
    Bounds2i pb(Point2i(2, 10), Point2i(18, 42));
    Point2i fullRes(1000, 200);
    std::map<std::string, std::vector<std::string>> stringVectors;
    stringVectors["yolo"] = {"foo", "bar"};

    outMetadata.cameraFromWorld = w2c;
    outMetadata.NDCFromWorld = w2n;
    outMetadata.pixelBounds = pb;
    outMetadata.fullResolution = fullRes;
    outMetadata.strings["pbrt"] = "v4";
    outMetadata.stringVectors = stringVectors;
    EXPECT_TRUE(image.Write(filename, outMetadata));

    ImageAndMetadata read = Image::Read(filename);
    ImageMetadata &inMetadata = read.metadata;

    EXPECT_EQ(*RGBColorSpace::Rec2020, *inMetadata.GetColorSpace());

    EXPECT_TRUE((bool)inMetadata.renderTimeSeconds);
    EXPECT_EQ(1234, *inMetadata.renderTimeSeconds);

    EXPECT_TRUE((bool)inMetadata.cameraFromWorld);
    EXPECT_EQ(*inMetadata.cameraFromWorld, w2c);

    EXPECT_TRUE((bool)inMetadata.NDCFromWorld);
    EXPECT_EQ(*inMetadata.NDCFromWorld, w2n);

    EXPECT_TRUE((bool)inMetadata.pixelBounds);
    EXPECT_EQ(*inMetadata.pixelBounds, pb);

    EXPECT_TRUE((bool)inMetadata.fullResolution);
    EXPECT_EQ(*inMetadata.fullResolution, fullRes);

    EXPECT_EQ(1, inMetadata.strings.size());
    EXPECT_EQ("v4", inMetadata.strings["pbrt"]);

    EXPECT_EQ(1, inMetadata.stringVectors.size());
    auto iter = stringVectors.find("yolo");
    EXPECT_TRUE(iter != stringVectors.end());
    EXPECT_EQ("foo", iter->second[0]);
    EXPECT_EQ("bar", iter->second[1]);

    EXPECT_TRUE(RemoveFile(filename.c_str()));
}